

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::I64ToI32Lowering(I64ToI32Lowering *this)

{
  WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__I64ToI32Lowering_011216e0;
  (this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
  _M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
  super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl = (Builder *)0x0;
  (this->indexMap)._M_h._M_buckets = &(this->indexMap)._M_h._M_single_bucket;
  (this->indexMap)._M_h._M_bucket_count = 1;
  (this->indexMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->indexMap)._M_h._M_element_count = 0;
  (this->indexMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->indexMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->indexMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->freeTemps)._M_h._M_buckets = &(this->freeTemps)._M_h._M_single_bucket;
  (this->freeTemps)._M_h._M_bucket_count = 1;
  (this->freeTemps)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->freeTemps)._M_h._M_element_count = 0;
  (this->freeTemps)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->freeTemps)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->freeTemps)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->highBitVars)._M_h._M_buckets = &(this->highBitVars)._M_h._M_single_bucket;
  (this->highBitVars)._M_h._M_bucket_count = 1;
  (this->highBitVars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->highBitVars)._M_h._M_element_count = 0;
  (this->highBitVars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->highBitVars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->highBitVars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tempTypes)._M_h._M_buckets = &(this->tempTypes)._M_h._M_single_bucket;
  (this->tempTypes)._M_h._M_bucket_count = 1;
  (this->tempTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tempTypes)._M_h._M_element_count = 0;
  (this->tempTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tempTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tempTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->originallyI64Globals)._M_h._M_buckets = &(this->originallyI64Globals)._M_h._M_single_bucket
  ;
  (this->originallyI64Globals)._M_h._M_bucket_count = 1;
  (this->originallyI64Globals)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->originallyI64Globals)._M_h._M_element_count = 0;
  (this->originallyI64Globals)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->originallyI64Globals)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->originallyI64Globals)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

bool addsEffects() override { return true; }